

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ternary_executor.hpp
# Opt level: O2

idx_t duckdb::TernaryExecutor::
      SelectLoop<duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::LowerInclusiveBetweenOperator,false,true,true>
                (uhugeint_t *adata,uhugeint_t *bdata,uhugeint_t *cdata,SelectionVector *result_sel,
                idx_t count,SelectionVector *asel,SelectionVector *bsel,SelectionVector *csel,
                ValidityMask *avalidity,ValidityMask *bvalidity,ValidityMask *cvalidity,
                SelectionVector *true_sel,SelectionVector *false_sel)

{
  uhugeint_t upper;
  uhugeint_t input;
  uhugeint_t lower;
  bool bVar1;
  idx_t iVar2;
  uint64_t row_idx;
  idx_t i;
  uint64_t uVar3;
  uint64_t row_idx_00;
  long lVar4;
  uint64_t uVar5;
  uint64_t row_idx_01;
  
  uVar3 = 0;
  lVar4 = 0;
  iVar2 = 0;
  do {
    if (count == uVar3) {
      return iVar2;
    }
    uVar5 = uVar3;
    if (result_sel->sel_vector != (sel_t *)0x0) {
      uVar5 = (uint64_t)result_sel->sel_vector[uVar3];
    }
    row_idx_01 = uVar3;
    if (asel->sel_vector != (sel_t *)0x0) {
      row_idx_01 = (uint64_t)asel->sel_vector[uVar3];
    }
    row_idx_00 = uVar3;
    if (bsel->sel_vector != (sel_t *)0x0) {
      row_idx_00 = (uint64_t)bsel->sel_vector[uVar3];
    }
    row_idx = uVar3;
    if (csel->sel_vector != (sel_t *)0x0) {
      row_idx = (uint64_t)csel->sel_vector[uVar3];
    }
    bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                      (&avalidity->super_TemplatedValidityMask<unsigned_long>,row_idx_01);
    if (bVar1) {
      bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (&bvalidity->super_TemplatedValidityMask<unsigned_long>,row_idx_00);
      if (!bVar1) goto LAB_01398037;
      bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (&cvalidity->super_TemplatedValidityMask<unsigned_long>,row_idx);
      if (!bVar1) goto LAB_01398037;
      input.upper = (uint64_t)result_sel;
      input.lower = (uint64_t)cdata;
      lower.upper = count;
      lower.lower = (uint64_t)asel;
      upper.upper = (uint64_t)bdata;
      upper.lower = (uint64_t)adata;
      bVar1 = LowerInclusiveBetweenOperator::Operation<duckdb::uhugeint_t>(input,lower,upper);
    }
    else {
LAB_01398037:
      bVar1 = false;
    }
    true_sel->sel_vector[iVar2] = (sel_t)uVar5;
    iVar2 = iVar2 + bVar1;
    false_sel->sel_vector[lVar4] = (sel_t)uVar5;
    lVar4 = lVar4 + (ulong)(bVar1 ^ 1);
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

static inline idx_t SelectLoop(const A_TYPE *__restrict adata, const B_TYPE *__restrict bdata,
	                               const C_TYPE *__restrict cdata, const SelectionVector *result_sel, idx_t count,
	                               const SelectionVector &asel, const SelectionVector &bsel,
	                               const SelectionVector &csel, ValidityMask &avalidity, ValidityMask &bvalidity,
	                               ValidityMask &cvalidity, SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
		for (idx_t i = 0; i < count; i++) {
			auto result_idx = result_sel->get_index(i);
			auto aidx = asel.get_index(i);
			auto bidx = bsel.get_index(i);
			auto cidx = csel.get_index(i);
			bool comparison_result =
			    (NO_NULL || (avalidity.RowIsValid(aidx) && bvalidity.RowIsValid(bidx) && cvalidity.RowIsValid(cidx))) &&
			    OP::Operation(adata[aidx], bdata[bidx], cdata[cidx]);
			if (HAS_TRUE_SEL) {
				true_sel->set_index(true_count, result_idx);
				true_count += comparison_result;
			}
			if (HAS_FALSE_SEL) {
				false_sel->set_index(false_count, result_idx);
				false_count += !comparison_result;
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}